

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void proto2_unittest::TestMutualRecursionA::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *pMVar3;
  char *failure_msg;
  void *pvVar4;
  int line;
  Arena *arena;
  TestMutualRecursionA *_this;
  TestMutualRecursionA *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestMutualRecursionA *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestMutualRecursionA_const*,proto2_unittest::TestMutualRecursionA*>
                          ((TestMutualRecursionA **)local_28,&local_30,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR>::MergeFrom
              (&(local_30->field_0)._impl_.subgroupr_,
               (RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR> *)
               &from_msg[1]._internal_metadata_);
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 3) != 0) {
      if ((uVar1 & 1) != 0) {
        pMVar2 = (MessageLite *)from_msg[3]._vptr_MessageLite;
        if (pMVar2 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.bb_ != nullptr";
          line = 0x5b33;
          goto LAB_00a190fa;
        }
        pMVar3 = *(MessageLite **)((long)&local_30->field_0 + 0x20);
        if (pMVar3 == (MessageLite *)0x0) {
          pvVar4 = google::protobuf::Arena::CopyConstruct<proto2_unittest::TestMutualRecursionB>
                             (arena,pMVar2);
          *(void **)((long)&local_30->field_0 + 0x20) = pvVar4;
        }
        else {
          TestMutualRecursionB::MergeImpl(pMVar3,pMVar2);
        }
      }
      if ((uVar1 & 2) != 0) {
        pMVar2 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
        if (pMVar2 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.subgroup_ != nullptr";
          line = 0x5b3b;
          goto LAB_00a190fa;
        }
        pMVar3 = *(MessageLite **)((long)&local_30->field_0 + 0x28);
        if (pMVar3 == (MessageLite *)0x0) {
          pvVar4 = google::protobuf::Arena::
                   CopyConstruct<proto2_unittest::TestMutualRecursionA_SubGroup>(arena,pMVar2);
          *(void **)((long)&local_30->field_0 + 0x28) = pvVar4;
        }
        else {
          TestMutualRecursionA_SubGroup::MergeImpl(pMVar3,pMVar2);
        }
      }
    }
    (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_30->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  line = 0x5b2a;
LAB_00a190fa:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest.pb.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void TestMutualRecursionA::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestMutualRecursionA*>(&to_msg);
  auto& from = static_cast<const TestMutualRecursionA&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestMutualRecursionA)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_subgroupr()->MergeFrom(
      from._internal_subgroupr());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.bb_ != nullptr);
      if (_this->_impl_.bb_ == nullptr) {
        _this->_impl_.bb_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.bb_);
      } else {
        _this->_impl_.bb_->MergeFrom(*from._impl_.bb_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.subgroup_ != nullptr);
      if (_this->_impl_.subgroup_ == nullptr) {
        _this->_impl_.subgroup_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.subgroup_);
      } else {
        _this->_impl_.subgroup_->MergeFrom(*from._impl_.subgroup_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}